

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O0

char16 * __thiscall
Js::DeserializationCloner<Js::StreamReader>::TryReadString
          (DeserializationCloner<Js::StreamReader> *this,charcount_t *len,bool reuseBuffer)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  Recycler *pRVar5;
  char16_t *pcVar6;
  undefined1 local_c0 [4];
  uint local_bc;
  uint32 padding;
  uint32 unalignedLen;
  undefined8 local_b0;
  TrackAllocData local_a8;
  Recycler *local_80;
  Recycler *recycler_1;
  undefined8 local_70;
  TrackAllocData local_68;
  Recycler *local_40;
  Recycler *recycler;
  char16 *buf;
  uint local_28;
  charcount_t newLen;
  uint32 byteLen;
  bool reuseBuffer_local;
  charcount_t *len_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  
  newLen._3_1_ = reuseBuffer;
  _byteLen = len;
  len_local = (charcount_t *)this;
  bVar2 = ThreadContext::IsOnStack(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                                ,0x1b1,"(ThreadContext::IsOnStack(this))",
                                "ThreadContext::IsOnStack(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  StreamReader::Read<unsigned_int>(this->m_reader,&local_28);
  if (local_28 == 0xffffffff) {
    this_local = (DeserializationCloner<Js::StreamReader> *)0x0;
  }
  else if (local_28 == 0) {
    *_byteLen = 0;
    this_local = (DeserializationCloner<Js::StreamReader> *)0x180ca08;
  }
  else {
    buf._4_4_ = local_28 >> 1;
    if ((newLen._3_1_ & 1) == 0) {
      pSVar4 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
      pRVar5 = ScriptContext::GetRecycler(pSVar4);
      local_80 = pRVar5;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_a8,(type_info *)&char16_t::typeinfo,0,(ulong)(buf._4_4_ + 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                 ,0x1d2);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_a8);
      _padding = Memory::Recycler::AllocLeaf;
      local_b0 = 0;
      recycler = (Recycler *)
                 Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                            (ulong)(buf._4_4_ + 1));
    }
    else {
      if (this->m_bufferLength < buf._4_4_) {
        pSVar4 = ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
        pRVar5 = ScriptContext::GetRecycler(pSVar4);
        local_40 = pRVar5;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_68,(type_info *)&char16_t::typeinfo,0,(ulong)(buf._4_4_ + 1),
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCADeserialization.cpp"
                   ,0x1c9);
        pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_68);
        recycler_1 = (Recycler *)Memory::Recycler::AllocLeaf;
        local_70 = 0;
        pcVar6 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                            (ulong)(buf._4_4_ + 1));
        this->m_buffer = pcVar6;
        this->m_bufferLength = buf._4_4_;
      }
      recycler = (Recycler *)this->m_buffer;
    }
    StreamReader::Read(this->m_reader,recycler,(ulong)local_28);
    *(undefined2 *)((long)&recycler->Cookie + (ulong)buf._4_4_ * 2) = 0;
    *_byteLen = buf._4_4_;
    local_bc = local_28 & 3;
    if (local_bc != 0) {
      StreamReader::Read(this->m_reader,local_c0,4 - (ulong)local_bc);
    }
    this_local = (DeserializationCloner<Js::StreamReader> *)recycler;
  }
  return (char16 *)this_local;
}

Assistant:

const char16* DeserializationCloner<Reader>::TryReadString(charcount_t* len, bool reuseBuffer) const
    {
        // m_buffer is allocated on GC heap and stored in a regular field.
        // that is ok since 'this' is always a stack instance.
        Assert(ThreadContext::IsOnStack(this));

        uint32 byteLen;
        m_reader->Read(&byteLen);

        if (byteLen == SCA_PROPERTY_TERMINATOR)
        {
            return nullptr;
        }
        else if (byteLen == 0)
        {
            *len = 0;
            return _u("");
        }
        else
        {
            charcount_t newLen = byteLen / sizeof(char16);
            char16* buf;

            if (reuseBuffer)
            {
                if (this->m_bufferLength < newLen)
                {
                    Recycler* recycler = this->GetScriptContext()->GetRecycler();
                    this->m_buffer = RecyclerNewArrayLeaf(recycler, char16, newLen + 1);
                    this->m_bufferLength = newLen;
                }

                buf = this->m_buffer;
            }
            else
            {
                Recycler* recycler = this->GetScriptContext()->GetRecycler();
                buf = RecyclerNewArrayLeaf(recycler, char16, newLen + 1);
            }

            m_reader->Read(buf, byteLen);
            buf[newLen] = NULL;
            *len = newLen;

            uint32 unalignedLen = byteLen % sizeof(uint32);
            if (unalignedLen)
            {
                uint32 padding;
                m_reader->Read(&padding, sizeof(uint32) - unalignedLen);
            }

            return buf;
        }
    }